

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vtabBestIndex(Parse *pParse,Table *pTab,sqlite3_index_info *p)

{
  sqlite3_vtab *psVar1;
  int rc_00;
  VTable *pVVar2;
  char *pcVar3;
  int rc;
  sqlite3_vtab *pVtab;
  sqlite3_index_info *p_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  pVVar2 = sqlite3GetVTable(pParse->db,pTab);
  psVar1 = pVVar2->pVtab;
  rc_00 = (*psVar1->pModule->xBestIndex)(psVar1,p);
  if ((rc_00 != 0) && (rc_00 != 0x13)) {
    if (rc_00 == 7) {
      sqlite3OomFault(pParse->db);
    }
    else if (psVar1->zErrMsg == (char *)0x0) {
      pcVar3 = sqlite3ErrStr(rc_00);
      sqlite3ErrorMsg(pParse,"%s",pcVar3);
    }
    else {
      sqlite3ErrorMsg(pParse,"%s",psVar1->zErrMsg);
    }
  }
  sqlite3_free(psVar1->zErrMsg);
  psVar1->zErrMsg = (char *)0x0;
  return rc_00;
}

Assistant:

static int vtabBestIndex(Parse *pParse, Table *pTab, sqlite3_index_info *p){
  sqlite3_vtab *pVtab = sqlite3GetVTable(pParse->db, pTab)->pVtab;
  int rc;

  TRACE_IDX_INPUTS(p);
  rc = pVtab->pModule->xBestIndex(pVtab, p);
  TRACE_IDX_OUTPUTS(p);

  if( rc!=SQLITE_OK && rc!=SQLITE_CONSTRAINT ){
    if( rc==SQLITE_NOMEM ){
      sqlite3OomFault(pParse->db);
    }else if( !pVtab->zErrMsg ){
      sqlite3ErrorMsg(pParse, "%s", sqlite3ErrStr(rc));
    }else{
      sqlite3ErrorMsg(pParse, "%s", pVtab->zErrMsg);
    }
  }
  sqlite3_free(pVtab->zErrMsg);
  pVtab->zErrMsg = 0;
  return rc;
}